

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_gl_load_GL_ARB_geometry_shader4(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_ARB_geometry_shader4 != 0) {
    glad_glFramebufferTextureARB =
         (PFNGLFRAMEBUFFERTEXTUREARBPROC)(*load)("glFramebufferTextureARB",userptr);
    glad_glProgramParameteriARB =
         (PFNGLPROGRAMPARAMETERIARBPROC)(*load)("glProgramParameteriARB",userptr);
    glad_glFramebufferTexture = (PFNGLFRAMEBUFFERTEXTUREPROC)(*load)("glFramebufferTexture",userptr)
    ;
    glad_glProgramParameteri = (PFNGLPROGRAMPARAMETERIPROC)(*load)("glProgramParameteri",userptr);
    glad_glFramebufferTextureLayerARB =
         (PFNGLFRAMEBUFFERTEXTURELAYERARBPROC)(*load)("glFramebufferTextureLayerARB",userptr);
    glad_glFramebufferTextureLayer =
         (PFNGLFRAMEBUFFERTEXTURELAYERPROC)(*load)("glFramebufferTextureLayer",userptr);
    glad_glFramebufferTextureFaceARB =
         (PFNGLFRAMEBUFFERTEXTUREFACEARBPROC)(*load)("glFramebufferTextureFaceARB",userptr);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_ARB_geometry_shader4( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_ARB_geometry_shader4) return;
    glFramebufferTextureARB = (PFNGLFRAMEBUFFERTEXTUREARBPROC) load("glFramebufferTextureARB", userptr);
    glProgramParameteriARB = (PFNGLPROGRAMPARAMETERIARBPROC) load("glProgramParameteriARB", userptr);
    glFramebufferTexture = (PFNGLFRAMEBUFFERTEXTUREPROC) load("glFramebufferTexture", userptr);
    glProgramParameteri = (PFNGLPROGRAMPARAMETERIPROC) load("glProgramParameteri", userptr);
    glFramebufferTextureLayerARB = (PFNGLFRAMEBUFFERTEXTURELAYERARBPROC) load("glFramebufferTextureLayerARB", userptr);
    glFramebufferTextureLayer = (PFNGLFRAMEBUFFERTEXTURELAYERPROC) load("glFramebufferTextureLayer", userptr);
    glFramebufferTextureFaceARB = (PFNGLFRAMEBUFFERTEXTUREFACEARBPROC) load("glFramebufferTextureFaceARB", userptr);
}